

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O3

void * rw::matfxClose(void *o,int32 param_2,int32 param_3)

{
  long lVar1;
  ObjPipeline *this;
  
  lVar1 = 1;
  this = DAT_0014b268;
  do {
    if (*(ObjPipeline **)(&matFXGlobals + lVar1 * 2) == this) {
      *(undefined8 *)(&matFXGlobals + lVar1 * 2) = 0;
      this = DAT_0014b268;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xe);
  ObjPipeline::destroy(this);
  DAT_0014b268 = (ObjPipeline *)0x0;
  return o;
}

Assistant:

static void*
matfxClose(void *o, int32, int32)
{
	for(uint i = 0; i < nelem(matFXGlobals.pipelines); i++)
		if(matFXGlobals.pipelines[i] == matFXGlobals.dummypipe)
			matFXGlobals.pipelines[i] = nil;
	matFXGlobals.dummypipe->destroy();
	matFXGlobals.dummypipe = nil;
	return o;
}